

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnt_st_seg.c
# Opt level: O2

uint32 * cnt_st_seg(model_def_t *mdef,lexicon_t *lex)

{
  acmod_set_t *acmod_set;
  int32 n_frame_00;
  acmod_id_t *phone_00;
  uint16 *seg_00;
  uint32 uVar1;
  int iVar2;
  uint32 *puVar3;
  char *utt_name;
  uint32 *ptr;
  ulong uVar4;
  uint uVar5;
  int32 n_frame;
  uint local_60;
  uint32 n_phone;
  acmod_id_t *phone;
  uint16 *seg;
  char *trans;
  lexicon_t *local_40;
  model_def_t *local_38;
  
  local_40 = lex;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
          ,0x62,"Counting # occ. for %u tied states\n",(ulong)mdef->n_tied_state);
  puVar3 = (uint32 *)
           __ckd_calloc__((ulong)mdef->n_tied_state,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
                          ,100);
  uVar1 = corpus_get_begin();
  local_38 = mdef;
  while( true ) {
    iVar2 = corpus_next_utt();
    if (iVar2 == 0) break;
    if (uVar1 % 0xfa == 0) {
      err_msg(ERR_INFOCONT,(char *)0x0,0," cnt[%u]",(ulong)uVar1);
    }
    local_60 = uVar1;
    corpus_get_sent(&trans);
    corpus_get_seg(&seg,&n_frame);
    mk_phone_seq(&phone,&n_phone,trans,mdef->acmod_set,local_40);
    seg_00 = seg;
    phone_00 = phone;
    uVar1 = n_phone;
    n_frame_00 = n_frame;
    acmod_set = mdef->acmod_set;
    utt_name = corpus_utt();
    mdef = local_38;
    ck_seg(acmod_set,phone_00,uVar1,seg_00,n_frame_00,utt_name);
    ptr = mk_sseq(seg,n_frame,phone,n_phone,mdef);
    ckd_free(phone);
    ckd_free(seg);
    ckd_free(trans);
    uVar5 = local_60;
    if (ptr == (uint32 *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
              ,0x6f,"senone sequence not produced; skipping.\n");
      uVar5 = local_60;
    }
    else {
      for (uVar4 = 0; (uint)n_frame != uVar4; uVar4 = uVar4 + 1) {
        puVar3[ptr[uVar4]] = puVar3[ptr[uVar4]] + 1;
      }
      ckd_free(ptr);
    }
    uVar1 = uVar5 + 1;
  }
  for (uVar4 = 0; uVar4 < mdef->n_tied_state; uVar4 = uVar4 + 1) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
            ,0x7c,"ts= %u cnt= %u\n",uVar4 & 0xffffffff,(ulong)puVar3[uVar4]);
  }
  return puVar3;
}

Assistant:

uint32 *
cnt_st_seg(model_def_t *mdef,
	   lexicon_t *lex)
{
    uint32 seq_no;
    uint32 n_frame;
    uint32 *sseq;
    uint32 *n_frame_per;
    uint32 i;

    E_INFO("Counting # occ. for %u tied states\n", mdef->n_tied_state);

    n_frame_per = ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    for (seq_no = corpus_get_begin(); corpus_next_utt(); seq_no++) {
	if (!(seq_no % 250)) {
	    E_INFOCONT(" cnt[%u]", seq_no);
	}
	
	/* Read transcript and convert it into a senone sequence */
	sseq = get_next_sseq(mdef, lex, &n_frame);

	if (sseq == NULL) {
	    E_WARN("senone sequence not produced; skipping.\n");

	    continue;
	}

	for (i = 0; i < n_frame; i++) {
	    n_frame_per[sseq[i]]++;
	}

	ckd_free(sseq);
    }

    for (i = 0; i < mdef->n_tied_state; i++) {
	E_INFO("ts= %u cnt= %u\n", i, n_frame_per[i]);
    }

    return n_frame_per;
}